

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void la_cross_call(TCGContext_conflict9 *s,int nt)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = s->tcg_target_call_clobber_regs;
  uVar3 = 0;
  uVar4 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x38 - uVar3 != 0; uVar3 = uVar3 + 0x38) {
    if ((*(byte *)((long)&s->temps[0].state + uVar3) & 1) == 0) {
      puVar2 = *(uint **)((long)&s->temps[0].state_ptr + uVar3);
      uVar5 = *puVar2 & ~uVar1;
      if (uVar5 == 0) {
        uVar5 = s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[uVar3]] & ~uVar1;
      }
      *puVar2 = uVar5;
    }
  }
  return;
}

Assistant:

static void la_cross_call(TCGContext *s, int nt)
{
    TCGRegSet mask = ~(s->tcg_target_call_clobber_regs);
    int i;

    for (i = 0; i < nt; i++) {
        TCGTemp *ts = &s->temps[i];
        if (!(ts->state & TS_DEAD)) {
            TCGRegSet *pset = la_temp_pref(ts);
            TCGRegSet set = *pset;

            set &= mask;
            /* If the combination is not possible, restart.  */
            if (set == 0) {
                set = s->tcg_target_available_regs[ts->type] & mask;
            }
            *pset = set;
        }
    }
}